

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O1

int Cof_ManTfoSize(Cof_Man_t *p,Cof_Obj_t **ppObjs,int nObjs)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  
  p->nTravIds = p->nTravIds + 1;
  if (nObjs < 1) {
    iVar3 = 0;
  }
  else {
    uVar2 = 0;
    iVar3 = 0;
    do {
      iVar1 = Cof_ManTfoSize_rec(p,ppObjs[uVar2]);
      iVar3 = iVar3 + iVar1 + -1;
      uVar2 = uVar2 + 1;
    } while ((uint)nObjs != uVar2);
  }
  return iVar3;
}

Assistant:

int Cof_ManTfoSize( Cof_Man_t * p, Cof_Obj_t ** ppObjs, int nObjs )
{
    int i, Counter = 0; 
    Cof_ManIncrementTravId( p );
    for ( i = 0; i < nObjs; i++ )
        Counter += Cof_ManTfoSize_rec( p, ppObjs[i] ) - 1;
    return Counter;
}